

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O1

size_t __thiscall websocketpp::http::parser::response::consume(response *this,char *buf,size_t len)

{
  size_t *psVar1;
  element_type *peVar2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  istream *piVar6;
  exception *peVar7;
  ulong uVar8;
  pointer __dest;
  ptrdiff_t _Num;
  size_t __n;
  iterator begin;
  char *pcVar9;
  string length;
  istringstream ss;
  string local_238;
  string local_218;
  char *local_1f8;
  string local_1f0;
  string local_1d0;
  key_type local_1b0 [3];
  ios_base local_138 [264];
  
  if (this->m_state != DONE) {
    if (this->m_state != BODY) {
      local_1f8 = buf;
      std::__cxx11::string::append
                ((char *)(this->m_buf).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(ulong)buf);
      peVar2 = (this->m_buf).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      begin._M_current = (peVar2->_M_dataplus)._M_p;
      end = std::
            __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (begin._M_current,begin._M_current + peVar2->_M_string_length,"\r\n","");
      __n = (long)end._M_current - (long)begin._M_current;
      uVar8 = (this->super_parser).m_header_bytes + 3 + __n;
      (this->super_parser).m_header_bytes = uVar8;
      if (uVar8 < 0x3e81) {
        peVar2 = (this->m_buf).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        __dest = (peVar2->_M_dataplus)._M_p;
        if (end._M_current != __dest + peVar2->_M_string_length) {
          do {
            if (end._M_current == begin._M_current) {
              if (this->m_state == RESPONSE_LINE) {
                peVar7 = (exception *)__cxa_allocate_exception(0x70);
                local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b0,"Incomplete Request","");
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                local_238._M_string_length = 0;
                local_238.field_2._M_local_buf[0] = '\0';
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                local_218._M_string_length = 0;
                local_218.field_2._M_local_buf[0] = '\0';
                exception::exception(peVar7,local_1b0,bad_request,&local_238,&local_218);
                __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
              }
              local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b0,"Content-Length","");
              cVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&(this->super_parser).m_headers._M_t,local_1b0);
              p_Var5 = (_Base_ptr)&empty_header_abi_cxx11_;
              if ((_Rb_tree_header *)cVar4._M_node !=
                  &(this->super_parser).m_headers._M_t._M_impl.super__Rb_tree_header) {
                p_Var5 = cVar4._M_node + 2;
              }
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_238,*(long *)p_Var5,
                         (long)&p_Var5->_M_parent->_M_color + *(long *)p_Var5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
                operator_delete(local_1b0[0]._M_dataplus._M_p);
              }
              if (local_238._M_string_length == 0) {
                this->m_read = 0;
              }
              else {
                std::__cxx11::istringstream::istringstream
                          ((istringstream *)local_1b0,(string *)&local_238,_S_in);
                piVar6 = std::istream::_M_extract<unsigned_long>((ulong *)local_1b0);
                if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
                  peVar7 = (exception *)__cxa_allocate_exception(0x70);
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_218,"Unable to parse Content-Length header","");
                  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                  local_1d0._M_string_length = 0;
                  local_1d0.field_2._M_local_buf[0] = '\0';
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  local_1f0._M_string_length = 0;
                  local_1f0.field_2._M_local_buf[0] = '\0';
                  exception::exception(peVar7,&local_218,bad_request,&local_1d0,&local_1f0);
                  __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
                }
                std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
                std::ios_base::~ios_base(local_138);
              }
              this->m_state = BODY;
              peVar2 = (this->m_buf).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              pcVar9 = end._M_current +
                       (len - (long)((peVar2->_M_dataplus)._M_p + peVar2->_M_string_length)) + 2;
              uVar8 = len - (long)pcVar9;
              if (pcVar9 <= len && uVar8 != 0) {
                uVar3 = this->m_read;
                if (uVar3 == 0) {
                  this->m_state = DONE;
                  uVar8 = 0;
                }
                else {
                  if (uVar3 <= uVar8) {
                    this->m_state = DONE;
                    uVar8 = uVar3;
                  }
                  std::__cxx11::string::append
                            ((char *)&(this->super_parser).m_body,(ulong)(local_1f8 + (long)pcVar9))
                  ;
                  this->m_read = this->m_read - uVar8;
                }
                pcVar9 = pcVar9 + uVar8;
              }
              this_00 = (this->m_buf).
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (this->m_buf).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (this->m_buf).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == &local_238.field_2) {
                return (size_t)pcVar9;
              }
              operator_delete(local_238._M_dataplus._M_p);
              return (size_t)pcVar9;
            }
            if (this->m_state == RESPONSE_LINE) {
              process(this,begin,(iterator)end._M_current);
              this->m_state = HEADERS;
            }
            else {
              parser::process_header(&this->super_parser,begin,(iterator)end._M_current);
            }
            begin._M_current = end._M_current + 2;
            peVar2 = (this->m_buf).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            end = std::
                  __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (begin._M_current,(peVar2->_M_dataplus)._M_p + peVar2->_M_string_length,
                             "\r\n","");
            __n = (long)end._M_current - (long)begin._M_current;
            uVar8 = (this->super_parser).m_header_bytes + 3 + __n;
            (this->super_parser).m_header_bytes = uVar8;
            if (16000 < uVar8) goto LAB_001a01d9;
            peVar2 = (this->m_buf).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            __dest = (peVar2->_M_dataplus)._M_p;
          } while (end._M_current != __dest + peVar2->_M_string_length);
        }
        if (end._M_current != begin._M_current) {
          memmove(__dest,begin._M_current,__n);
        }
        std::__cxx11::string::resize
                  ((ulong)(this->m_buf).
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(char)__n);
        this->m_read = this->m_read + len;
        psVar1 = &(this->super_parser).m_header_bytes;
        *psVar1 = *psVar1 - ((this->m_buf).
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_M_string_length;
        return len;
      }
LAB_001a01d9:
      peVar7 = (exception *)__cxa_allocate_exception(0x70);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Maximum header size exceeded.","");
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      exception::exception(peVar7,local_1b0,request_header_fields_too_large,&local_238,&local_218);
      __cxa_throw(peVar7,&exception::typeinfo,exception::~exception);
    }
    uVar8 = this->m_read;
    if (uVar8 != 0) {
      if (uVar8 <= len) {
        this->m_state = DONE;
        len = uVar8;
      }
      std::__cxx11::string::append((char *)&(this->super_parser).m_body,(ulong)buf);
      this->m_read = this->m_read - len;
      return len;
    }
    this->m_state = DONE;
  }
  return 0;
}

Assistant:

inline size_t response::consume(char const * buf, size_t len) {
    if (m_state == DONE) {return 0;}

    if (m_state == BODY) {
        return this->process_body(buf,len);
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end = begin;


    for (;;) {
        // search for delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter + sizeof(header_delimiter) - 1
        );

        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));

            m_read += len;
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.

        if (end-begin == 0) {
            // we got a blank line
            if (m_state == RESPONSE_LINE) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            // TODO: grab content-length
            std::string length = get_header("Content-Length");

            if (length.empty()) {
                // no content length found, read indefinitely
                m_read = 0;
            } else {
                std::istringstream ss(length);

                if ((ss >> m_read).fail()) {
                    throw exception("Unable to parse Content-Length header",
                                    status_code::bad_request);
                }
            }

            m_state = BODY;

            // calc header bytes processed (starting bytes - bytes left)
            size_t read = (
                len - static_cast<std::string::size_type>(m_buf->end() - end)
                + sizeof(header_delimiter) - 1
            );

            // if there were bytes left process them as body bytes
            if (read < len) {
                read += this->process_body(buf+read,(len-read));
            }

            // frees memory used temporarily during header parsing
            m_buf.reset();

            return read;
        } else {
            if (m_state == RESPONSE_LINE) {
                this->process(begin,end);
                m_state = HEADERS;
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter) - 1);
    }
}